

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void ppu_mode3_synchronize(Emulator *e)

{
  ColorPalettes *pCVar1;
  byte bVar2;
  u8 uVar3;
  TileDataSelect TVar4;
  ObjSize OVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  uint uVar12;
  RGBA RVar13;
  ulong uVar14;
  ColorPalettes *pCVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  ushort uVar19;
  uint uVar20;
  byte bVar21;
  PaletteRGBA *pPVar22;
  PaletteRGBA *pPVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  byte bVar30;
  byte bVar31;
  undefined8 unaff_R15;
  bool bVar32;
  bool bVar33;
  Bool bg_is_zero [4];
  Bool bg_priority [4];
  char local_f1;
  RGBA *local_f0;
  uint local_e0;
  uint local_dc;
  ulong local_d0;
  uint local_78 [10];
  ulong local_50;
  ColorPalettes *local_48;
  ulong local_40;
  ulong local_38;
  
  bVar30 = (e->state).ppu.render_x;
  local_38 = CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar30);
  if (bVar30 < 0xa0 && (e->state).ppu.stat.mode == PPU_MODE_MODE3) {
    if (((e->state).is_cgb == FALSE) && ((e->state).ppu.lcdc.bg_display == FALSE)) {
      bVar32 = false;
    }
    else {
      bVar32 = (e->config).disable_bg == FALSE;
    }
    iVar7 = 0;
    if ((e->state).ppu.lcdc.obj_display == FALSE) {
      bVar33 = false;
    }
    else {
      bVar33 = (e->config).disable_obj == FALSE;
    }
    bVar2 = (e->state).ppu.line_y;
    if (((((e->state).ppu.rendering_window == FALSE) &&
         (iVar7 = 0xff, (e->state).ppu.lcdc.window_display != FALSE)) &&
        ((e->config).disable_window == FALSE)) &&
       ((uVar27 = (uint)(e->state).ppu.wx, uVar27 < 0xa7 && ((e->state).ppu.wy <= bVar2)))) {
      iVar16 = uVar27 - bVar30;
      iVar7 = 7;
      if (7 < iVar16) {
        iVar7 = iVar16;
      }
      iVar7 = iVar7 + -7;
    }
    local_d0 = (e->state).ppu.mode3_render_ticks;
    local_50 = (e->state).ticks;
    uVar27 = (uint)local_38;
    if (local_d0 < local_50) {
      local_f0 = ppu_mode3_synchronize::s_dummy_frame_buffer_line;
      if ((e->state).sgb.mask == SGB_MASK_CANCEL) {
        local_f0 = e->frame_buffer + ((uint)bVar2 * 0xa0 + (uint)bVar30);
      }
      bVar9 = (e->state).ppu.scy + bVar2;
      local_e0 = (uint)bVar9;
      local_dc = (uint)(bVar9 >> 3) * 0x20 +
                 (uint)((e->state).ppu.lcdc.bg_tile_map_select != TILE_MAP_9800_9BFF) * 0x400 +
                 0x1800;
      uVar14 = (ulong)(byte)((e->state).ppu.scx + bVar30);
      TVar4 = (e->state).ppu.lcdc.bg_tile_data_select;
      pCVar1 = &(e->state).ppu.bgcp;
      local_48 = &(e->state).ppu.obcp;
      local_f1 = -bVar30;
      uVar12 = (uint)(byte)(bVar30 + 7);
      uVar25 = 0;
      pPVar23 = (PaletteRGBA *)0x0;
      bVar30 = 0;
      bVar9 = 0;
      uVar29 = 0;
      do {
        local_78[2] = 1;
        local_78[3] = 1;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        lVar8 = 0;
        do {
          bVar31 = (byte)uVar14;
          if (iVar7 == (int)lVar8) {
            (e->state).ppu.rendering_window = TRUE;
            uVar25 = 0;
            uVar14 = (ulong)((uint)(byte)-(e->state).ppu.wx + uVar12 + (int)lVar8);
            local_e0 = (uint)(e->state).ppu.win_y;
            local_dc = (uint)((e->state).ppu.lcdc.window_tile_map_select != TILE_MAP_9800_9BFF) *
                       0x400 + (local_e0 & 0xf8) * 4 + 0x1800;
            bVar32 = true;
LAB_0010c66e:
            bVar31 = (byte)uVar14;
            uVar20 = (uint)((byte)(uVar14 >> 3) & 0x1f);
            uVar27 = uVar20 | local_dc;
            if ((short)uVar25 == (short)uVar27) {
              bVar30 = bVar30 * '\x02';
              bVar9 = bVar9 * '\x02';
              uVar27 = uVar25;
            }
            else {
              uVar14 = (ulong)(uVar20 | local_dc);
              bVar30 = (e->state).vram.data[uVar14];
              bVar9 = (byte)local_e0 & 7;
              uVar19 = (ushort)bVar30;
              if (TVar4 == TILE_DATA_8800_97FF) {
                uVar19 = (short)(char)bVar30 + 0x100;
              }
              if ((e->state).is_cgb == FALSE) {
                pPVar23 = e->pal;
                if ((e->state).is_sgb != FALSE) {
                  pPVar23 = (PaletteRGBA *)
                            ((long)e->sgb_pal[0].color +
                            (ulong)(((e->state).sgb.attr_map
                                     [(int)((local_38 & 0xff) >> 3) + (bVar2 >> 1 & 0x7ffffffc) * 5
                                      >> 2] >> (~((byte)(local_38 >> 2) & 0x3f) & 6) & 3) << 4));
                }
                uVar14 = (ulong)(ushort)(uVar19 * 0x10 + (ushort)bVar9 * 2);
                bVar30 = (e->state).vram.data[uVar14];
                bVar9 = (e->state).vram.data[uVar14 + 1];
                bVar21 = 0;
              }
              else {
                bVar24 = (e->state).vram.data[uVar14 + 0x2000];
                pPVar23 = (PaletteRGBA *)
                          ((long)pCVar1->palettes[0].color + (ulong)((bVar24 & 7) << 4));
                bVar21 = bVar24 >> 7;
                bVar9 = bVar9 * '\x02';
                bVar30 = bVar9 ^ 0xe;
                if ((bVar24 & 0x40) == 0) {
                  bVar30 = bVar9;
                }
                uVar14 = (ulong)((uint)bVar30 | (short)uVar19 * 0x10 + (bVar24 & 8) * 0x400 & 0xffff
                                );
                bVar30 = (e->state).vram.data[uVar14];
                bVar9 = (e->state).vram.data[uVar14 + 1];
                if ((bVar24 & 0x20) != 0) {
                  bVar30 = bVar30 << 4 | bVar30 >> 4;
                  bVar30 = bVar30 >> 2 & 0x33 | (bVar30 & 0x33) << 2;
                  bVar30 = bVar30 >> 1 & 0x55 | (bVar30 & 0x55) * '\x02';
                  bVar9 = bVar9 << 4 | bVar9 >> 4;
                  bVar9 = bVar9 >> 2 & 0x33 | (bVar9 & 0x33) << 2;
                  bVar9 = bVar9 >> 1 & 0x55 | (bVar9 & 0x55) * '\x02';
                }
              }
              uVar29 = (uint)bVar21;
              bVar30 = bVar30 << (bVar31 & 7);
              bVar9 = bVar9 << (bVar31 & 7);
            }
            bVar21 = bVar30 >> 7 | bVar9 >> 6 & 2;
            local_f0[lVar8] = pPVar23->color[bVar21];
            local_78[lVar8] = (uint)(bVar21 == 0);
            local_78[lVar8 + 4] = uVar29;
            uVar25 = uVar27;
          }
          else {
            if (bVar32) goto LAB_0010c66e;
            pCVar15 = pCVar1;
            if (((e->state).is_cgb == FALSE) &&
               (pCVar15 = (ColorPalettes *)e->sgb_pal, (e->state).is_sgb == FALSE)) {
              RVar13 = e->color_to_rgba[0].color[0];
            }
            else {
              RVar13 = pCVar15->palettes[0].color[0];
            }
            local_f0[lVar8] = RVar13;
            bVar32 = false;
          }
          lVar8 = lVar8 + 1;
          uVar14 = (ulong)(byte)(bVar31 + 1);
        } while (lVar8 != 4);
        if (((e->state).is_cgb != FALSE) && ((e->state).ppu.lcdc.bg_display == FALSE)) {
          local_78[2] = 0x1010101;
          local_78[3] = 0x1010101;
          local_78[4] = 0;
          local_78[5] = 0;
          local_78[6] = 0;
          local_78[7] = 0;
        }
        if ((bVar33) && (uVar28 = (ulong)(e->state).ppu.line_obj_count, uVar28 != 0)) {
          OVar5 = (e->state).ppu.lcdc.obj_size;
          local_40 = (ulong)OVar5;
          bVar31 = "\b\x10"[OVar5];
          uVar17 = local_38;
          do {
            uVar3 = (e->state).ppu.line_obj[uVar28 - 1].x;
            cVar10 = uVar3 - (char)uVar17;
            bVar21 = cVar10 + 7;
            if ((bVar21 < 0xb) &&
               (bVar24 = bVar2 - (e->state).ppu.line_obj[uVar28 - 1].y, bVar24 < bVar31)) {
              bVar18 = ~bVar24 + bVar31;
              if ((e->state).ppu.line_obj[uVar28 - 1].yflip == FALSE) {
                bVar18 = bVar24;
              }
              bVar24 = (e->state).ppu.line_obj[uVar28 - 1].tile;
              if (OVar5 == OBJ_SIZE_8X16) {
                if (bVar18 < 8) {
                  bVar24 = bVar24 & 0xfe;
                }
                else {
                  bVar24 = bVar24 | 1;
                  bVar18 = bVar18 - 8;
                }
              }
              uVar19 = (ushort)bVar24;
              if ((e->state).is_cgb == FALSE) {
                pPVar22 = e->pal + (ulong)(e->state).ppu.line_obj[uVar28 - 1].palette + 1;
              }
              else {
                pPVar22 = (PaletteRGBA *)
                          ((long)local_48->palettes[0].color +
                          (ulong)(((e->state).ppu.line_obj[uVar28 - 1].cgb_palette & 7) << 4));
                if ((e->state).ppu.line_obj[uVar28 - 1].bank != '\0') {
                  uVar19 = uVar19 + 0x200;
                }
              }
              uVar17 = (ulong)((uint)uVar19 * 0x10 + (uint)(bVar18 & 7) * 2);
              bVar24 = (e->state).vram.data[uVar17];
              bVar18 = (e->state).vram.data[uVar17 + 1];
              if ((e->state).ppu.line_obj[uVar28 - 1].xflip == FALSE) {
                bVar24 = bVar24 << 4 | bVar24 >> 4;
                bVar24 = bVar24 >> 2 & 0x33 | (bVar24 & 0x33) << 2;
                bVar24 = bVar24 >> 1 & 0x55 | (bVar24 & 0x55) * '\x02';
                bVar18 = bVar18 << 4 | bVar18 >> 4;
                bVar18 = bVar18 >> 2 & 0x33 | (bVar18 & 0x33) << 2;
                bVar18 = bVar18 >> 1 & 0x55 | (bVar18 & 0x55) * '\x02';
              }
              if (2 < bVar21) {
                bVar21 = 3;
              }
              if (cVar10 <= (char)bVar21) {
                bVar11 = -cVar10;
                if (-1 < cVar10) {
                  bVar11 = 0;
                }
                uVar20 = (uint)(bVar18 >> (bVar11 & 0x1f));
                uVar26 = (uint)(bVar24 >> (bVar11 & 0x1f));
                bVar24 = uVar3 + local_f1;
                uVar27 = (uint)bVar24;
                if ((char)bVar24 < '\x01') {
                  uVar27 = 0;
                }
                uVar17 = (ulong)uVar27 - 1;
                do {
                  uVar27 = (uVar26 & 1) + (uVar20 & 1) * 2;
                  if (((uVar27 != 0) && ((local_78[uVar17 + 5] == 0 || (local_78[uVar17 + 1] != 0)))
                      ) && (((e->state).ppu.line_obj[uVar28 - 1].priority == OBJ_PRIORITY_ABOVE_BG
                            || (local_78[uVar17 + 1] != 0)))) {
                    local_f0[uVar17 + 1] = pPVar22->color[uVar27];
                  }
                  uVar26 = uVar26 >> 1;
                  uVar20 = uVar20 >> 1;
                  uVar17 = uVar17 + 1;
                } while (uVar17 < bVar21);
              }
            }
            bVar6 = 1 < (long)uVar28;
            uVar28 = uVar28 - 1;
            uVar17 = local_38;
          } while (bVar6);
        }
        local_d0 = local_d0 + 4;
        uVar27 = (int)local_38 + 4;
        if (local_50 <= local_d0) break;
        local_f0 = local_f0 + 4;
        local_f1 = local_f1 + -4;
        uVar12 = uVar12 + 4;
        iVar7 = iVar7 + -4;
        bVar31 = (byte)local_38;
        local_38 = (ulong)uVar27;
      } while (bVar31 < 0x9c);
      (e->state).ppu.mode3_render_ticks = local_d0;
    }
    (e->state).ppu.render_x = (u8)uVar27;
  }
  return;
}

Assistant:

static void ppu_mode3_synchronize(Emulator* e) {
  u8 x = PPU.render_x;
  const u8 y = PPU.line_y;
  if (STAT.mode != PPU_MODE_MODE3 || x >= SCREEN_WIDTH) return;

  Bool display_bg = (IS_CGB || LCDC.bg_display) && !e->config.disable_bg;
  const Bool display_obj = LCDC.obj_display && !e->config.disable_obj;
  Bool rendering_window = PPU.rendering_window;
  int window_counter = rendering_window ? 0 : 255;
  if (!rendering_window && LCDC.window_display && !e->config.disable_window &&
      PPU.wx <= WINDOW_MAX_X && y >= PPU.wy) {
    window_counter = MAX(0, PPU.wx - (x + WINDOW_X_OFFSET));
  }

  const TileDataSelect data_select = LCDC.bg_tile_data_select;
  u8 mx = PPU.scx + x;
  u8 my = PPU.scy + y;
  u16 map_base = map_select_to_address(LCDC.bg_tile_map_select) |
                 ((my >> 3) * TILE_MAP_WIDTH);
  RGBA* pixel;
  if (SGB.mask != SGB_MASK_CANCEL) {
    static RGBA s_dummy_frame_buffer_line[SCREEN_WIDTH];
    pixel = s_dummy_frame_buffer_line;
  } else {
    pixel = &e->frame_buffer[y * SCREEN_WIDTH + x];
  }

  /* Cache map_addr info. */
  u16 map_addr = 0;
  PaletteRGBA* pal = NULL;
  u8 lo = 0, hi = 0;

  Bool priority = FALSE;
  int i;
  for (; PPU.mode3_render_ticks < TICKS && x < SCREEN_WIDTH;
       PPU.mode3_render_ticks += CPU_TICK, pixel += 4, x += 4) {
    Bool bg_is_zero[4] = {TRUE, TRUE, TRUE, TRUE},
         bg_priority[4] = {FALSE, FALSE, FALSE, FALSE};

    for (i = 0; i < 4; ++i, ++mx) {
      if (UNLIKELY(window_counter-- == 0)) {
        PPU.rendering_window = rendering_window = display_bg = TRUE;
        mx = x + i + WINDOW_X_OFFSET - PPU.wx;
        my = PPU.win_y;
        map_base = map_select_to_address(LCDC.window_tile_map_select) |
                   ((my >> 3) * TILE_MAP_WIDTH);
        map_addr = 0;
      }
      if (display_bg) {
        u16 new_map_addr = map_base | (mx >> 3);
        if (map_addr == new_map_addr) {
          lo <<= 1;
          hi <<= 1;
        } else {
          map_addr = new_map_addr;
          u16 tile_index = VRAM.data[map_addr];
          u8 my7 = my & 7;
          if (data_select == TILE_DATA_8800_97FF) {
            tile_index = 256 + (s8)tile_index;
          }
          if (IS_CGB) {
            u8 attr = VRAM.data[0x2000 + map_addr];
            pal = &PPU.bgcp.palettes[attr & 0x7];
            if (attr & 0x08) { tile_index += 0x200; }
            if (attr & 0x40) { my7 = 7 - my7; }
            priority = (attr & 0x80) != 0;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
            if (attr & 0x20) {
              lo = reverse_bits_u8(lo);
              hi = reverse_bits_u8(hi);
            }
          } else {
            if (IS_SGB) {
              int idx = (y >> 3) * (SCREEN_WIDTH >> 3) + (x >> 3);
              u8 palidx = (SGB.attr_map[idx >> 2] >> (2 * (3 - (idx & 3)))) & 3;
              pal = &e->sgb_pal[palidx];
            } else {
              pal = &e->pal[PALETTE_TYPE_BGP];
            }
            priority = FALSE;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
          }
          u8 shift = mx & 7;
          lo <<= shift;
          hi <<= shift;
        }
        u8 palette_index = ((hi >> 6) & 2) | (lo >> 7);
        pixel[i] = pal->color[palette_index];
        bg_is_zero[i] = palette_index == 0;
        bg_priority[i] = priority;
      } else {
        if (IS_CGB) {
          pixel[i] = PPU.bgcp.palettes[0].color[0];
        } else if (IS_SGB) {
          pixel[i] = e->sgb_pal[0].color[0];
        } else {
          pixel[i] = e->color_to_rgba[0].color[0];
        }
      }
    }

    /* LCDC bit 0 works differently on cgb; when it's cleared OBJ will always
     * have priority over bg and window. */
    if (IS_CGB && !LCDC.bg_display) {
      memset(&bg_is_zero, TRUE, sizeof(bg_is_zero));
      memset(&bg_priority, FALSE, sizeof(bg_priority));
    }

    if (display_obj) {
      u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
      int n;
      for (n = PPU.line_obj_count - 1; n >= 0; --n) {
        Obj* o = &PPU.line_obj[n];
        /* Does [x, x + 4) intersect [o->x, o->x + 8)? Note that the sums must
         * wrap at 256 (i.e. arithmetic is 8-bit). */
        s8 ox_start = o->x - x;
        s8 ox_end = ox_start + 7; /* ox_end is inclusive. */
        u8 oy = y - o->y;
        if (((u8)ox_start >= 4 && (u8)ox_end >= 8) || oy >= obj_height) {
          continue;
        }

        if (o->yflip) {
          oy = obj_height - 1 - oy;
        }

        u16 tile_index = o->tile;
        if (obj_height == 16) {
          if (oy < 8) {
            /* Top tile of 8x16 sprite. */
            tile_index &= 0xfe;
          } else {
            /* Bottom tile of 8x16 sprite. */
            tile_index |= 0x01;
            oy -= 8;
          }
        }
        PaletteRGBA* pal = NULL;
        if (IS_CGB) {
          pal = &PPU.obcp.palettes[o->cgb_palette & 0x7];
          if (o->bank) { tile_index += 0x200; }
        } else {
          pal = &e->pal[o->palette + 1];
        }
        u16 tile_addr = (tile_index * TILE_HEIGHT + (oy & 7)) * TILE_ROW_BYTES;
        u8 lo = VRAM.data[tile_addr];
        u8 hi = VRAM.data[tile_addr + 1];
        if (!o->xflip) {
          lo = reverse_bits_u8(lo);
          hi = reverse_bits_u8(hi);
        }

        int tile_data_offset = MAX(0, -ox_start);
        assert(tile_data_offset >= 0 && tile_data_offset < 8);
        lo >>= tile_data_offset;
        hi >>= tile_data_offset;

        int start = MAX(0, ox_start);
        assert(start >= 0 && start < 4);
        int end = MIN(3, ox_end); /* end is inclusive. */
        assert(end >= 0 && end < 4);
        for (i = start; i <= end; ++i, lo >>= 1, hi >>= 1) {
          u8 palette_index = ((hi & 1) << 1) | (lo & 1);
          if (palette_index != 0 && (!bg_priority[i] || bg_is_zero[i]) &&
              (o->priority == OBJ_PRIORITY_ABOVE_BG || bg_is_zero[i])) {
            pixel[i] = pal->color[palette_index];
          }
        }
      }
    }
  }
  PPU.render_x = x;
}